

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>const>,Eigen::Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>const,1,_1,false>const>,Eigen::Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,1,_1,false>>>
               (Transpose<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                *lhs,Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
                     *rhs,
               Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
               *dest,Scalar *alpha)

{
  Index *this;
  long lVar1;
  ScalarWithConstIfNotLvalue *res;
  Index IVar2;
  TransposeImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Dense>
  *pTVar3;
  Index cols;
  size_t size;
  EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
  *pEVar4;
  PointerArgType dataPtr;
  ResScalar alpha_00;
  ulong uVar5;
  double *pdVar6;
  Index IVar7;
  Index resIncr;
  ScalarWithConstIfNotLvalue **ppSVar8;
  Scalar SVar9;
  Scalar SVar10;
  ScalarWithConstIfNotLvalue *local_278;
  double local_270;
  Index local_268;
  TransposeImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Dense>
  *local_260;
  Index local_258;
  Scalar *local_250;
  double *local_248;
  size_t local_240;
  EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
  *local_238;
  PointerArgType local_230;
  Index local_228;
  double *local_220;
  double *local_218;
  double *local_210;
  double local_208;
  double local_200;
  BlockImpl_dense<Eigen::Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>,__1,_1,_true,_true>
  local_1f8;
  const_blas_data_mapper<double,_long,_0> local_190;
  const_blas_data_mapper<double,_long,_1> local_180 [2];
  Stride<0,_0> local_15a;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_158;
  undefined1 local_140 [8];
  aligned_stack_memory_handler<double> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  double dStack_118;
  gemv_static_vector_if<double,__1,__1,_true> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
  *dest_local;
  Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>
  *rhs_local;
  Transpose<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  *lhs_local;
  
  ppSVar8 = &local_278;
  actualRhs.m_matrix.
  super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
  .m_outerStride =
       (Index)blas_traits<Eigen::Transpose<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>_>
              ::extract(lhs);
  blas_traits<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
  ::extract((ExtractType *)&actualAlpha,rhs);
  local_208 = *alpha;
  SVar9 = blas_traits<Eigen::Transpose<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>_>
          ::extractScalarFactor(lhs);
  local_200 = local_208 * SVar9;
  SVar10 = blas_traits<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
           ::extractScalarFactor(rhs);
  dStack_118 = local_200 * SVar10;
  uVar5 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
          ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
                  *)&actualAlpha);
  if (0x1fffffffffffffff < uVar5) {
    throw_std_bad_alloc();
  }
  pdVar6 = gemv_static_vector_if<double,_-1,_-1,_true>::data
                     ((gemv_static_vector_if<double,__1,__1,_true> *)((long)&actualRhsPtr + 7));
  if (pdVar6 == (double *)0x0) {
    IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
            ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
                    *)&actualAlpha);
    if ((ulong)(IVar7 * 8) < 0x20001) {
      IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
                      *)&actualAlpha);
      lVar1 = -(IVar7 * 8 + 0x1eU & 0xfffffffffffffff0);
      ppSVar8 = (ScalarWithConstIfNotLvalue **)((long)&local_278 + lVar1);
      local_218 = (double *)((long)&local_270 + lVar1);
    }
    else {
      IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
                      *)&actualAlpha);
      local_218 = (double *)aligned_malloc(IVar7 << 3);
    }
    local_210 = local_218;
  }
  else {
    local_210 = gemv_static_vector_if<double,_-1,_-1,_true>::data
                          ((gemv_static_vector_if<double,__1,__1,_true> *)((long)&actualRhsPtr + 7))
    ;
    ppSVar8 = &local_278;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_210;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b617d;
  pdVar6 = gemv_static_vector_if<double,_-1,_-1,_true>::data
                     ((gemv_static_vector_if<double,__1,__1,_true> *)((long)&actualRhsPtr + 7));
  if (pdVar6 == (double *)0x0) {
    local_220 = (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_220 = (double *)0x0;
  }
  local_248 = local_220;
  local_238 = (EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
               *)&actualAlpha;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b61bf;
  local_240 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
              ::size((EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
                      *)&actualAlpha);
  pEVar4 = local_238;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b61d2;
  IVar7 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
          ::size(pEVar4);
  size = local_240;
  pdVar6 = local_248;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b61fc;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_140,pdVar6,size,
             0x20000 < (ulong)(IVar7 << 3));
  pEVar4 = local_238;
  local_230 = (PointerArgType)actualRhsPtr_stack_memory_destructor._16_8_;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b6216;
  local_228 = EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
              ::size(pEVar4);
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b6229;
  Stride<0,_0>::Stride(&local_15a);
  IVar2 = local_228;
  dataPtr = local_230;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b624c;
  Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (&local_158,dataPtr,IVar2,&local_15a);
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b6261;
  Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>> *)&local_158,
             (DenseBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
              *)&actualAlpha);
  this = &actualRhs.m_matrix.
          super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
          .m_outerStride;
  local_260 = (TransposeImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Dense>
               *)this;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b6276;
  local_268 = Transpose<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
              ::rows((Transpose<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      *)this);
  pTVar3 = local_260;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b6289;
  local_258 = Transpose<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
              ::cols((Transpose<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      *)pTVar3);
  pTVar3 = local_260;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b629c;
  local_250 = TransposeImpl<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Dense>
              ::data(pTVar3);
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b62b1;
  local_270 = (double)TransposeImpl<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Dense>
                      ::outerStride((TransposeImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Dense>
                                     *)&actualRhs.m_matrix.
                                        super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
                                        .
                                        super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
                                        .m_outerStride);
  local_180[0].super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = local_250;
  local_190.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
       (double *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_190.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 1;
  local_180[0].super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = (long)local_270;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b63d3;
  local_278 = TransposeImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>,_Eigen::Dense>
              ::data((TransposeImpl<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_Eigen::Dense>
                      *)dest);
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b63f3;
  DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>_>
  ::col((ColXpr *)&local_1f8,
        (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>_>
         *)dest,0);
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b6401;
  resIncr = BlockImpl_dense<Eigen::Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>,_-1,_1,_true,_true>
            ::innerStride(&local_1f8);
  alpha_00 = dStack_118;
  cols = local_258;
  IVar2 = local_268;
  res = local_278;
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b6434;
  general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
  ::run(IVar2,cols,local_180,&local_190,res,resIncr,alpha_00);
  *(undefined8 *)((long)ppSVar8 + -8) = 0x1b6442;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_140);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }